

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

Ref<anurbs::BrepTrim> __thiscall
anurbs::Model::add<anurbs::BrepTrim>(Model *this,string *key,Pointer<anurbs::BrepTrim> *data)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  invalid_argument *piVar4;
  pointer ppVar5;
  type *ptVar6;
  element_type *peVar7;
  runtime_error *this_00;
  size_type sVar8;
  mapped_type *this_01;
  shared_ptr<anurbs::BrepTrim> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::BrepTrim> RVar9;
  shared_ptr<anurbs::Entry<anurbs::BrepTrim>_> local_110;
  unsigned_long local_100;
  pair<unsigned_long,_unsigned_long> local_f8;
  shared_ptr<anurbs::Entry<anurbs::BrepTrim>_> local_e8;
  shared_ptr<anurbs::BrepTrim> local_d8;
  string local_c8;
  size_type local_a0;
  size_type index_1;
  size_type local_60;
  type index;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
  local_50;
  iterator it;
  Pointer<Entry<BrepTrim>_> entry;
  Pointer<anurbs::BrepTrim> *data_local;
  string *key_local;
  Model *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Key is empty");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = std::operator==(in_RCX,(nullptr_t)0x0);
  if (!bVar1) {
    std::shared_ptr<anurbs::Entry<anurbs::BrepTrim>_>::shared_ptr
              ((shared_ptr<anurbs::Entry<anurbs::BrepTrim>_> *)&it);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                 *)&key[1].field_2,(key_type *)data);
    index = (type)std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                  ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                         *)&key[1].field_2);
    bVar1 = std::__detail::operator!=
                      (&local_50,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                        *)&index);
    if (bVar1) {
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
                             *)&local_50);
      ptVar6 = std::get<0ul,unsigned_long,unsigned_long>(&ppVar5->second);
      local_60 = *ptVar6;
      std::
      vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
      ::operator[]((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                    *)key,local_60);
      std::static_pointer_cast<anurbs::Entry<anurbs::BrepTrim>,anurbs::EntryBase>
                ((shared_ptr<anurbs::EntryBase> *)&stack0xffffffffffffff90);
      std::shared_ptr<anurbs::Entry<anurbs::BrepTrim>_>::operator=
                ((shared_ptr<anurbs::Entry<anurbs::BrepTrim>_> *)&it,
                 (shared_ptr<anurbs::Entry<anurbs::BrepTrim>_> *)&stack0xffffffffffffff90);
      std::shared_ptr<anurbs::Entry<anurbs::BrepTrim>_>::~shared_ptr
                ((shared_ptr<anurbs::Entry<anurbs::BrepTrim>_> *)&stack0xffffffffffffff90);
      peVar7 = std::
               __shared_ptr_access<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&it);
      uVar2 = (*(peVar7->super_EntryBase)._vptr_EntryBase[2])();
      if ((uVar2 & 1) == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Entry already exists");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      peVar7 = std::
               __shared_ptr_access<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&it);
      std::shared_ptr<anurbs::BrepTrim>::shared_ptr
                ((shared_ptr<anurbs::BrepTrim> *)&stack0xffffffffffffff80,in_RCX);
      Entry<anurbs::BrepTrim>::set_data
                (peVar7,(shared_ptr<anurbs::BrepTrim> *)&stack0xffffffffffffff80);
      std::shared_ptr<anurbs::BrepTrim>::~shared_ptr
                ((shared_ptr<anurbs::BrepTrim> *)&stack0xffffffffffffff80);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&key->field_2 + 8),
                 &local_60);
      sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         ((long)&key->field_2 + 8));
      index_1 = sVar8 - 1;
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_true>
                ((pair<unsigned_long,_unsigned_long> *)&stack0xffffffffffffff70,&local_60,&index_1);
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_false,_true>
                             *)&local_50);
      std::pair<unsigned_long,_unsigned_long>::operator=
                (&ppVar5->second,(type)&stack0xffffffffffffff70);
    }
    else {
      local_a0 = std::
                 vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                 ::size((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                         *)key);
      std::__cxx11::string::string((string *)&local_c8,(string *)data);
      std::shared_ptr<anurbs::BrepTrim>::shared_ptr(&local_d8,in_RCX);
      Entry<anurbs::BrepTrim>::create
                ((Entry<anurbs::BrepTrim> *)&stack0xffffffffffffff58,&local_c8,&local_d8);
      std::shared_ptr<anurbs::Entry<anurbs::BrepTrim>>::operator=
                ((shared_ptr<anurbs::Entry<anurbs::BrepTrim>> *)&it,
                 (unique_ptr<anurbs::Entry<anurbs::BrepTrim>,_std::default_delete<anurbs::Entry<anurbs::BrepTrim>_>_>
                  *)&stack0xffffffffffffff58);
      std::
      unique_ptr<anurbs::Entry<anurbs::BrepTrim>,_std::default_delete<anurbs::Entry<anurbs::BrepTrim>_>_>
      ::~unique_ptr((unique_ptr<anurbs::Entry<anurbs::BrepTrim>,_std::default_delete<anurbs::Entry<anurbs::BrepTrim>_>_>
                     *)&stack0xffffffffffffff58);
      std::shared_ptr<anurbs::BrepTrim>::~shared_ptr(&local_d8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::static_pointer_cast<anurbs::EntryBase,anurbs::Entry<anurbs::BrepTrim>>(&local_e8);
      std::
      vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
      ::push_back((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
                   *)key,(value_type *)&local_e8);
      std::shared_ptr<anurbs::EntryBase>::~shared_ptr((shared_ptr<anurbs::EntryBase> *)&local_e8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)&key->field_2 + 8),
                 &stack0xffffffffffffff60);
      sVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         ((long)&key->field_2 + 8));
      local_100 = sVar8 - 1;
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_true>
                (&local_f8,&stack0xffffffffffffff60,&local_100);
      this_01 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                              *)&key[1].field_2,(key_type *)data);
      std::pair<unsigned_long,_unsigned_long>::operator=(this_01,&local_f8);
    }
    std::shared_ptr<anurbs::Entry<anurbs::BrepTrim>_>::shared_ptr
              (&local_110,(shared_ptr<anurbs::Entry<anurbs::BrepTrim>_> *)&it);
    Ref<anurbs::BrepTrim>::Ref((Ref<anurbs::BrepTrim> *)this,&local_110);
    std::shared_ptr<anurbs::Entry<anurbs::BrepTrim>_>::~shared_ptr(&local_110);
    std::shared_ptr<anurbs::Entry<anurbs::BrepTrim>_>::~shared_ptr
              ((shared_ptr<anurbs::Entry<anurbs::BrepTrim>_> *)&it);
    RVar9.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    RVar9.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Ref<anurbs::BrepTrim>)
           RVar9.m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::BrepTrim>,_(__gnu_cxx::_Lock_policy)2>;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Data is null");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Ref<TData> add(const std::string& key, Pointer<TData> data)
    {
        if (key.empty()) {
            throw std::invalid_argument("Key is empty");
        }
        if (data == nullptr) {
            throw std::invalid_argument("Data is null");
        }

        Pointer<Entry<TData>> entry;

        const auto it = m_key_map.find(key);

        if (it != m_key_map.end()) {
            const auto index = std::get<0>(it->second);

            entry = std::static_pointer_cast<Entry<TData>>(m_entries[index]);

            if (!entry->is_empty()) {
                throw std::runtime_error("Entry already exists");
            }

            entry->set_data(data);

            m_entry_map.push_back(index);

            it->second = { index, m_entry_map.size() - 1 };
        } else {
            const auto index = m_entries.size();

            entry = Entry<TData>::create(key, data);

            m_entries.push_back(std::static_pointer_cast<EntryBase>(entry));

            m_entry_map.push_back(index);

            m_key_map[key] = { index, m_entry_map.size() - 1 };
        }

        return Ref<TData>(entry);
    }